

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall xercesc_4_0::AbstractDOMParser::startDocument(AbstractDOMParser *this)

{
  int iVar1;
  DOMImplementation *pDVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *actualEncoding;
  DOMNode *pDVar4;
  DOMDocumentImpl *pDVar5;
  long lVar3;
  
  if (this->fImplementationFeatures == (XMLCh *)0x0) {
    pDVar2 = DOMImplementation::getImplementation();
  }
  else {
    pDVar2 = DOMImplementationRegistry::getDOMImplementation(this->fImplementationFeatures);
  }
  iVar1 = (*(pDVar2->super_DOMImplementationLS)._vptr_DOMImplementationLS[10])
                    (pDVar2,this->fMemoryManager);
  lVar3 = CONCAT44(extraout_var,iVar1);
  pDVar5 = (DOMDocumentImpl *)(lVar3 + -8);
  if (lVar3 == 0) {
    pDVar5 = (DOMDocumentImpl *)0x0;
  }
  pDVar4 = &(pDVar5->super_DOMDocument).super_DOMNode;
  if (lVar3 == 0) {
    pDVar4 = (DOMNode *)0x0;
  }
  this->fDocument = pDVar5;
  this->fCurrentParent = pDVar4;
  this->fCurrentNode = pDVar4;
  pDVar5->errorChecking = false;
  iVar1 = (*(this->fScanner->fReaderMgr).super_Locator._vptr_Locator[3])
                    (&this->fScanner->fReaderMgr);
  (*(pDVar5->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5d])
            (pDVar5,CONCAT44(extraout_var_00,iVar1));
  pDVar5 = this->fDocument;
  actualEncoding = ReaderMgr::getCurrentEncodingStr(&this->fScanner->fReaderMgr);
  DOMDocumentImpl::setInputEncoding(pDVar5,actualEncoding);
  return;
}

Assistant:

void AbstractDOMParser::startDocument()
{
    if(fImplementationFeatures == 0)
        fDocument = (DOMDocumentImpl *)DOMImplementation::getImplementation()->createDocument(fMemoryManager);
    else
        fDocument = (DOMDocumentImpl *)DOMImplementationRegistry::getDOMImplementation(fImplementationFeatures)->createDocument(fMemoryManager);

    // Just set the document as the current parent and current node
    fCurrentParent = fDocument;
    fCurrentNode   = fDocument;
    // set DOM error checking off
    fDocument->setErrorChecking(false);
    fDocument->setDocumentURI(fScanner->getLocator()->getSystemId());
    fDocument->setInputEncoding(fScanner->getReaderMgr()->getCurrentEncodingStr());
}